

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O2

string * __thiscall
mnf::RealSpace::toString
          (string *__return_storage_ptr__,RealSpace *this,ConstRefVec *val,string *prefix,
          IOFormat *fmt)

{
  ostream *s;
  stringstream ss;
  stringstream asStack_2a8 [16];
  ostream local_298 [376];
  WithFormat<Eigen::Transpose<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
  local_120;
  
  std::__cxx11::stringstream::stringstream(asStack_2a8);
  s = std::operator<<(local_298,(string *)prefix);
  local_120.m_matrix.m_matrix = val;
  Eigen::IOFormat::IOFormat(&local_120.m_format,fmt);
  Eigen::operator<<(s,&local_120);
  Eigen::IOFormat::~IOFormat(&local_120.m_format);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_2a8);
  return __return_storage_ptr__;
}

Assistant:

std::string RealSpace::toString(const ConstRefVec& val,
                                const std::string& prefix,
                                const Eigen::IOFormat& fmt) const
{
  std::stringstream ss;
  ss << prefix << val.transpose().format(fmt);
  return ss.str();
}